

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.h
# Opt level: O0

_Bool bitset_next_set_bit(bitset_t *bitset,size_t *i)

{
  unsigned_long_long input_num;
  int iVar1;
  ulong input_num_00;
  ulong *in_RSI;
  long *in_RDI;
  uint64_t w;
  size_t x;
  ulong local_20;
  _Bool local_1;
  
  local_20 = *in_RSI >> 6;
  if (local_20 < (ulong)in_RDI[1]) {
    input_num_00 = *(ulong *)(*in_RDI + local_20 * 8) >> ((byte)*in_RSI & 0x3f);
    if (input_num_00 == 0) {
      do {
        local_20 = local_20 + 1;
        if ((ulong)in_RDI[1] <= local_20) {
          return false;
        }
        input_num = *(unsigned_long_long *)(*in_RDI + local_20 * 8);
      } while (input_num == 0);
      iVar1 = roaring_trailing_zeroes(input_num);
      *in_RSI = local_20 * 0x40 + (long)iVar1;
      local_1 = true;
    }
    else {
      iVar1 = roaring_trailing_zeroes(input_num_00);
      *in_RSI = (long)iVar1 + *in_RSI;
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool bitset_next_set_bit(const bitset_t *bitset, size_t *i) {
    size_t x = *i / 64;
    if (x >= bitset->arraysize) {
        return false;
    }
    uint64_t w = bitset->array[x];
    w >>= (*i & 63);
    if (w != 0) {
        *i += roaring_trailing_zeroes(w);
        return true;
    }
    x++;
    while (x < bitset->arraysize) {
        w = bitset->array[x];
        if (w != 0) {
            *i = x * 64 + roaring_trailing_zeroes(w);
            return true;
        }
        x++;
    }
    return false;
}